

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O2

pair<int,_int> __thiscall libtorrent::aux::parse_utf8_codepoint(aux *this,string_view str)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  pair<int,_int> pVar4;
  pair<int,_int> pVar5;
  pair<int,_int> pVar6;
  pair<int,_int> pVar7;
  ulong uVar8;
  pair<int,_int> pVar9;
  uint uVar10;
  ulong uVar11;
  
  uVar3 = 0xffffffff;
  if (this == (aux *)0x0) {
    pVar7.first = -1;
    pVar7.second = 0;
    return pVar7;
  }
  bVar1 = *(byte *)str._M_len;
  if (-1 < (long)(char)bVar1) {
    return (pair<int,_int>)((long)(char)bVar1 + 0x100000000);
  }
  uVar10 = (uint)bVar1;
  if ((uVar10 & 0xffffffe0) == 0xc0) {
    uVar2 = 2;
  }
  else if ((bVar1 & 0xf0) == 0xe0) {
    uVar2 = 3;
  }
  else {
    if ((uVar10 & 0xfffffff8) != 0xf0) {
      uVar8 = (ulong)((uVar10 & 0xfffffffc) == 0xf8) << 0x22;
      uVar3 = 0x1ffffffff;
      goto LAB_00337f32;
    }
    uVar2 = 4;
  }
  if ((int)this < (int)uVar2) {
    return (pair<int,_int>)((long)this << 0x20 | 0xffffffff);
  }
  uVar10 = uVar10 & 0x70f1fU >> ((char)uVar2 * '\b' - 0x10U & 0x1f);
  uVar8 = (ulong)uVar2;
  for (uVar11 = 1; uVar8 != uVar11; uVar11 = uVar11 + 1) {
    bVar1 = ((byte *)str._M_len)[uVar11];
    if (-0x41 < (char)bVar1) goto LAB_00337f2e;
    uVar10 = uVar10 << 6 | bVar1 & 0x3f;
  }
  if (uVar2 == 4) {
    if ((int)uVar10 < 0x10000) {
      pVar5.first = -1;
      pVar5.second = 4;
      return pVar5;
    }
  }
  else if (uVar2 == 3) {
    if ((int)uVar10 < 0x800) {
      pVar4.first = -1;
      pVar4.second = 3;
      return pVar4;
    }
  }
  else if ((int)uVar10 < 0x80) {
    pVar6.first = -1;
    pVar6.second = 2;
    return pVar6;
  }
  if (uVar10 < 0x110000) {
    uVar8 = uVar8 << 0x20;
    if ((uVar10 & 0x1ff800) != 0xd800) {
      pVar9.second = uVar2;
      pVar9.first = uVar10;
      return pVar9;
    }
  }
  else {
LAB_00337f2e:
    uVar8 = uVar8 << 0x20;
  }
LAB_00337f32:
  return (pair<int,_int>)(uVar3 | uVar8);
}

Assistant:

std::pair<std::int32_t, int> parse_utf8_codepoint(string_view str)
	{
		TORRENT_ASSERT(!str.empty());
		if (str.empty()) return std::make_pair(-1, 0);

		int const sequence_len = utf8_sequence_length(str[0]);

		// this is likely the most common case
		if (sequence_len == 1) return std::make_pair(std::int32_t(str[0]), sequence_len);

		// if we find an invalid sequence length, skip one byte
		if (sequence_len == 0)
			return std::make_pair(-1, 1);

		if (sequence_len > 4)
			return std::make_pair(-1, sequence_len);

		if (sequence_len > int(str.size()))
			return std::make_pair(-1, static_cast<int>(str.size()));

		std::int32_t ch = 0;
		// first byte
		switch (sequence_len)
		{
			case 1:
				ch = str[0] & 0b01111111;
				break;
			case 2:
				ch = str[0] & 0b00011111;
				break;
			case 3:
				ch = str[0] & 0b00001111;
				break;
			case 4:
				ch = str[0] & 0b00000111;
				break;
		}
		for (int i = 1; i < sequence_len; ++i)
		{
			auto const b = static_cast<std::uint8_t>(str[static_cast<std::size_t>(i)]);
			// continuation bytes must start with 10xxxxxx
			if (b > 0b10111111 || b < 0b10000000)
				return std::make_pair(-1, sequence_len);
			ch <<= 6;
			ch += b & 0b111111;
		}

		// check if the sequence is overlong, i.e. whether it has leading
		// (redundant) zeros
		switch (sequence_len)
		{
			case 2:
				if (ch < 0x80) return std::make_pair(-1, sequence_len);
				break;
			case 3:
				if (ch < 0x800) return std::make_pair(-1, sequence_len);
				break;
			case 4:
				if (ch < 0x10000) return std::make_pair(-1, sequence_len);
				break;
		}

		if (ch > max_codepoint)
			return std::make_pair(-1, sequence_len);

		// per RFC 3629, surrogates should not appear in utf-8
		if (ch >= surrogate_start && ch <= surrogate_end)
			return std::make_pair(-1, sequence_len);

		return std::make_pair(static_cast<std::int32_t>(ch), sequence_len);
	}